

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

DArray<int> *
Lib::DArray<int>::fromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>
          (IterTraits<Lib::RangeIterator<int>_> it,size_t count)

{
  IterTraits<Lib::RangeIterator<int>_> it_00;
  IterTraits<Lib::RangeIterator<int>_> it_01;
  IterTraits<Lib::RangeIterator<int>_> it_02;
  bool bVar1;
  long in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  DArray<int> *in_RDI;
  DArray<int> *out;
  DArray<int> *this;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  this = in_RDI;
  DArray(in_RDI,(size_t)in_RDI);
  if (in_RCX == 0) {
    bVar1 = IterTraits<Lib::RangeIterator<int>_>::knowsSize
                      ((IterTraits<Lib::RangeIterator<int>_> *)0x88a919);
    if (bVar1) {
      IterTraits<Lib::RangeIterator<int>_>::size((IterTraits<Lib::RangeIterator<int>_> *)0x88a94e);
      it_01._iter._from = in_stack_ffffffffffffff80;
      it_01._iter._next = in_stack_ffffffffffffff7c;
      it_01._iter._to = in_stack_ffffffffffffff84;
      initFromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>(this,it_01,(size_t)in_RDI);
    }
    else {
      it_02._iter._from = in_EDX;
      it_02._iter._next = (int)((ulong)in_RSI >> 0x20);
      it_02._iter._to = in_stack_ffffffffffffff84;
      initFromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>(this,it_02,(size_t)in_RDI);
    }
  }
  else {
    it_00._iter._from = in_stack_ffffffffffffff80;
    it_00._iter._next = in_stack_ffffffffffffff7c;
    it_00._iter._to = in_stack_ffffffffffffff84;
    initFromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>(this,it_00,(size_t)in_RDI);
  }
  return this;
}

Assistant:

static DArray fromIterator(It it, size_t count=0) {
    DArray out;
    if (count != 0) {
      out.initFromIterator(it, count);
    } else if (it.knowsSize()) {
      out.initFromIterator(it, it.size());
    } else {
      out.initFromIterator(it);
    }
    return out;
  }